

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O2

char * nullcGetFunctionName(uint funcID)

{
  FastVector<char,_false,_false> *this;
  ExternFuncInfo *pEVar1;
  char *pcVar2;
  
  if (NULLCTypeInfo::linker != 0) {
    this = (FastVector<char,_false,_false> *)(NULLCTypeInfo::linker + 0x290);
    pEVar1 = FastVector<ExternFuncInfo,_false,_false>::operator[]
                       ((FastVector<ExternFuncInfo,_false,_false> *)(NULLCTypeInfo::linker + 0x240),
                        funcID);
    pcVar2 = FastVector<char,_false,_false>::operator[](this,pEVar1->offsetToName);
    return pcVar2;
  }
  __assert_fail("NULLCTypeInfo::linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x1e7,"const char *nullcGetFunctionName(unsigned int)");
}

Assistant:

const char*		nullcGetFunctionName(unsigned int funcID)
{
	assert(NULLCTypeInfo::linker);
	return &NULLCTypeInfo::linker->exSymbols[NULLCTypeInfo::linker->exFunctions[funcID].offsetToName];
}